

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numpy.h
# Opt level: O0

object pybind11::dtype::_dtype_from_pep3118(void)

{
  int iVar1;
  PyObject **ppPVar2;
  handle in_RDI;
  object *in_stack_ffffffffffffff88;
  PyObject *pPVar3;
  handle key;
  handle in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  handle local_10 [2];
  
  key.m_ptr = in_RDI.m_ptr;
  if (_dtype_from_pep3118()::obj == '\0') {
    iVar1 = __cxa_guard_acquire(&_dtype_from_pep3118()::obj);
    if (iVar1 != 0) {
      module_::import(in_stack_ffffffffffffffb8);
      detail::object_api<pybind11::handle>::attr
                ((object_api<pybind11::handle> *)in_stack_ffffffffffffffa8.m_ptr,(char *)key.m_ptr);
      detail::accessor<pybind11::detail::accessor_policies::str_attr>::cast<pybind11::object>
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)in_RDI.m_ptr);
      local_10[0] = object::release(in_stack_ffffffffffffff88);
      ppPVar2 = pybind11::handle::ptr(local_10);
      pPVar3 = *ppPVar2;
      object::~object((object *)0x19a44a);
      detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x19a454);
      module_::~module_((module_ *)0x19a45e);
      _dtype_from_pep3118::obj = pPVar3;
      __cxa_guard_release(&_dtype_from_pep3118()::obj);
    }
  }
  pybind11::handle::handle((handle *)&stack0xffffffffffffffa8,_dtype_from_pep3118::obj);
  reinterpret_borrow<pybind11::object>(in_RDI);
  return (object)(handle)key.m_ptr;
}

Assistant:

static object _dtype_from_pep3118() {
        static PyObject *obj = module_::import("numpy.core._internal")
            .attr("_dtype_from_pep3118").cast<object>().release().ptr();
        return reinterpret_borrow<object>(obj);
    }